

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::handle_exception(torrent *this)

{
  bool bVar1;
  alert_manager *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int extraout_EDX;
  __uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  in_RSI;
  string sStack_5a0;
  string sStack_580;
  char acStack_560 [1044];
  int iStack_14c;
  string sStack_148;
  undefined1 auStack_128 [40];
  undefined1 *puStack_100;
  torrent *local_c0;
  system_error *err;
  exception *err_1;
  torrent *local_10;
  torrent *this_local;
  
  puStack_100 = (undefined1 *)0x66d6bf;
  local_c0 = this;
  local_10 = this;
  __cxa_rethrow();
  uVar3 = *(undefined8 *)
           in_RSI._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  (this->m_error).val_ = (int)uVar3;
  (this->m_error).failed_ = (bool)(char)((ulong)uVar3 >> 0x20);
  *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar3 >> 0x28);
  (this->m_error).cat_ =
       *(error_category **)
        ((long)in_RSI._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl + 8);
  (this->m_error_file).m_val = extraout_EDX;
  auStack_128._16_8_ =
       in_RSI._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  auStack_128._24_8_ = this;
  auStack_128._36_4_ = extraout_EDX;
  puStack_100 = (undefined1 *)&this_local;
  update_gauge(this);
  paVar2 = alerts(this);
  bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar2);
  if (bVar1) {
    paVar2 = alerts(this);
    get_handle((torrent *)auStack_128);
    uVar3 = auStack_128._16_8_;
    iStack_14c = auStack_128._36_4_;
    resolve_filename_abi_cxx11_(&sStack_148,this,(file_index_t)auStack_128._36_4_);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string>
              (paVar2,(torrent_handle *)auStack_128,(error_code *)uVar3,&sStack_148);
    ::std::__cxx11::string::~string((string *)&sStack_148);
    torrent_handle::~torrent_handle((torrent_handle *)auStack_128);
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_128._16_8_);
  if (bVar1) {
    boost::system::error_code::message_abi_cxx11_(&sStack_580,(error_code *)auStack_128._16_8_);
    uVar3 = ::std::__cxx11::string::c_str();
    resolve_filename_abi_cxx11_(&sStack_5a0,this,(file_index_t)auStack_128._36_4_);
    uVar4 = ::std::__cxx11::string::c_str();
    snprintf(acStack_560,0x400,"error %s: %s",uVar3,uVar4);
    ::std::__cxx11::string::~string((string *)&sStack_5a0);
    ::std::__cxx11::string::~string((string *)&sStack_580);
    log_to_all_peers(this,acStack_560);
  }
  state_updated(this);
  update_state_list(this);
  return;
}

Assistant:

void torrent::handle_exception()
	{
		try
		{
			throw;
		}
		catch (system_error const& err)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: (%d) %s: %s"
					, err.code().value(), err.code().message().c_str()
					, err.what());
			}
#endif
			set_error(err.code(), torrent_status::error_file_exception);
		}
		catch (std::exception const& err)
		{
			TORRENT_UNUSED(err);
			set_error(error_code(), torrent_status::error_file_exception);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: %s", err.what());
			}
#endif
		}
		catch (...)
		{
			set_error(error_code(), torrent_status::error_file_exception);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: unknown");
			}
#endif
		}
	}